

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_send_attach(LINK_ENDPOINT_HANDLE link_endpoint,ATTACH_HANDLE attach)

{
  int iVar1;
  AMQP_VALUE performative;
  AMQP_VALUE attach_performative_value;
  LINK_ENDPOINT_INSTANCE *link_endpoint_instance;
  int result;
  ATTACH_HANDLE attach_local;
  LINK_ENDPOINT_HANDLE link_endpoint_local;
  
  if ((link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) || (attach == (ATTACH_HANDLE)0x0)) {
    link_endpoint_instance._4_4_ = 0x535;
  }
  else {
    iVar1 = attach_set_handle(attach,link_endpoint->output_handle);
    if (iVar1 == 0) {
      performative = amqpvalue_create_attach(attach);
      if (performative == (AMQP_VALUE)0x0) {
        link_endpoint_instance._4_4_ = 0x544;
      }
      else {
        iVar1 = encode_frame(link_endpoint,performative,(PAYLOAD *)0x0,0);
        if (iVar1 == 0) {
          link_endpoint_instance._4_4_ = 0;
        }
        else {
          link_endpoint_instance._4_4_ = 0x54a;
        }
        amqpvalue_destroy(performative);
      }
    }
    else {
      link_endpoint_instance._4_4_ = 0x53d;
    }
  }
  return link_endpoint_instance._4_4_;
}

Assistant:

int session_send_attach(LINK_ENDPOINT_HANDLE link_endpoint, ATTACH_HANDLE attach)
{
    int result;

    if ((link_endpoint == NULL) ||
        (attach == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;

        if (attach_set_handle(attach, link_endpoint_instance->output_handle) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE attach_performative_value = amqpvalue_create_attach(attach);
            if (attach_performative_value == NULL)
            {
                result = MU_FAILURE;
            }
            else
            {
                if (encode_frame(link_endpoint, attach_performative_value, NULL, 0) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }

                amqpvalue_destroy(attach_performative_value);
            }
        }
    }

    return result;
}